

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QAbstractButton_*>::insert_impl
          (QVLABase<QAbstractButton_*> *this,qsizetype prealloc,void *array,const_iterator before,
          qsizetype n,QAbstractButton **t)

{
  const_iterator ppQVar1;
  iterator ppQVar2;
  iterator mid;
  void *in_RCX;
  qsizetype in_RDX;
  QVLABase<QAbstractButton_*> *in_RSI;
  QVLABaseBase *in_RDI;
  QAbstractButton **in_R8;
  qsizetype in_stack_00000008;
  iterator e;
  iterator b;
  qsizetype offset;
  void *array_00;
  QVLABase<QAbstractButton_*> *this_00;
  
  array_00 = in_RCX;
  ppQVar1 = cbegin((QVLABase<QAbstractButton_*> *)0x67733e);
  this_00 = in_RSI;
  QVLABaseBase::size(in_RDI);
  resize_impl(this_00,in_RDX,array_00,in_stack_00000008,in_R8);
  ppQVar2 = begin((QVLABase<QAbstractButton_*> *)0x67739a);
  ppQVar2 = ppQVar2 + ((long)in_RCX - (long)ppQVar1 >> 3);
  mid = end(in_RSI);
  QtPrivate::q_rotate<QAbstractButton*>(ppQVar2,mid,(QAbstractButton **)in_RDI);
  return ppQVar2;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::insert_impl(qsizetype prealloc, void *array, const_iterator before, qsizetype n, const T &t) -> iterator
{
    Q_ASSERT_X(isValidIterator(before), "QVarLengthArray::insert", "The specified const_iterator argument 'before' is invalid");

    const qsizetype offset = qsizetype(before - cbegin());
    resize_impl(prealloc, array, size() + n, t);
    const auto b = begin() + offset;
    const auto e = end();
    QtPrivate::q_rotate(b, e - n, e);
    return b;
}